

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_ComputeState(ARKodeMem ark_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  
  if (ark_mem->step_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0x864,"arkStep_ComputeState",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    N_VLinearSum(0x3ff0000000000000,0,*(undefined8 *)((long)ark_mem->step_mem + 0x48),zcor,z);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkStep_ComputeState(ARKodeMem ark_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return (ARK_SUCCESS);
}